

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LazyJSONString.cpp
# Opt level: O3

char16 * __thiscall Js::LazyJSONString::GetSz(LazyJSONString *this)

{
  code *pcVar1;
  bool bVar2;
  charcount_t bufferLength;
  BOOL BVar3;
  char16 *pcVar4;
  Recycler *this_00;
  undefined4 *puVar5;
  undefined1 local_58 [8];
  JSONStringBuilder builder;
  
  pcVar4 = JavascriptString::UnsafeGetBuffer(&this->super_JavascriptString);
  if (pcVar4 != (char16 *)0x0) {
    pcVar4 = JavascriptString::UnsafeGetBuffer(&this->super_JavascriptString);
    return pcVar4;
  }
  bufferLength = JavascriptString::SafeSzSize(&this->super_JavascriptString);
  local_58 = (undefined1  [8])&char16_t::typeinfo;
  builder.scriptContext = (ScriptContext *)0x0;
  builder.currentLocation =
       L"/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/LazyJSONString.cpp"
  ;
  builder.jsonContent._0_4_ = 0xbb;
  builder.endLocation = (char16 *)(ulong)bufferLength;
  this_00 = Memory::Recycler::TrackAllocInfo
                      (((((((this->super_JavascriptString).super_RecyclableObject.type.ptr)->
                          javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                       recycler,(TrackAllocData *)local_58);
  if (bufferLength == 0) {
    Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
    pcVar4 = (char16 *)&DAT_00000008;
  }
  else {
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00d2e9bc;
      *puVar5 = 0;
    }
    pcVar4 = (char16 *)
             Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                       (this_00,(long)(ulong)bufferLength * 2);
    if (pcVar4 == (char16 *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_00d2e9bc:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
      pcVar4 = (char16 *)0x0;
    }
  }
  JSONStringBuilder::JSONStringBuilder
            ((JSONStringBuilder *)local_58,
             (((((this->super_JavascriptString).super_RecyclableObject.type.ptr)->javascriptLibrary)
              .ptr)->super_JavascriptLibraryBase).scriptContext.ptr,(this->jsonContent).ptr,pcVar4,
             bufferLength,(this->gap).ptr,*(charcount_t *)&(this->super_JavascriptString).field_0x1c
            );
  JSONStringBuilder::Build((JSONStringBuilder *)local_58);
  JavascriptString::SetBuffer(&this->super_JavascriptString,pcVar4);
  (this->jsonContent).ptr = (JSONProperty *)0x0;
  return pcVar4;
}

Assistant:

const char16*
LazyJSONString::GetSz()
{
    if (this->IsFinalized())
    {
        return this->UnsafeGetBuffer();
    }

    const charcount_t allocSize = this->SafeSzSize();

    Recycler* recycler = GetScriptContext()->GetRecycler();
    char16* target = RecyclerNewArrayLeaf(recycler, char16, allocSize);

    JSONStringBuilder builder(
        this->GetScriptContext(),
        this->jsonContent,
        target,
        allocSize,
        this->gap,
        this->gapLength);

    builder.Build();

    this->SetBuffer(target);

    // You probably aren't going to parse if you are using the string buffer
    // Let's throw away the metadata so we can reclaim the memory
    this->jsonContent = nullptr;

    return target;
}